

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_biquad_init(ma_biquad_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                        ma_biquad *pBQ)

{
  ma_result mVar1;
  void *pHeap;
  size_t __size;
  
  if (pConfig == (ma_biquad_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  if ((ulong)pConfig->channels == 0) {
    return MA_INVALID_ARGS;
  }
  __size = (ulong)pConfig->channels << 3;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pHeap = malloc(__size);
  }
  else {
    if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
      return MA_OUT_OF_MEMORY;
    }
    pHeap = (*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
  }
  if (pHeap == (void *)0x0) {
    return MA_OUT_OF_MEMORY;
  }
  mVar1 = ma_biquad_init_preallocated(pConfig,pHeap,pBQ);
  if (mVar1 == MA_SUCCESS) {
    pBQ->_ownsHeap = 1;
    return MA_SUCCESS;
  }
  ma_free(pHeap,pAllocationCallbacks);
  return mVar1;
}

Assistant:

MA_API ma_result ma_biquad_init(const ma_biquad_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_biquad* pBQ)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_biquad_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_biquad_init_preallocated(pConfig, pHeap, pBQ);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBQ->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}